

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double log_series_pdf(int x,double a)

{
  double dVar1;
  double dVar2;
  
  if (0 < x) {
    dVar1 = pow(a,(double)x);
    dVar2 = log(1.0 - a);
    return -dVar1 / (dVar2 * (double)x);
  }
  return 0.0;
}

Assistant:

double log_series_pdf ( int x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_SERIES_PDF evaluates the Logarithmic Series PDF.
//
//  Discussion:
//
//    PDF(A;X) = - A^X / ( X * log ( 1 - A ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the argument of the PDF.
//    0 < X
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A < 1.0.
//
//    Output, double LOG_SERIES_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x <= 0 )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = - pow ( a, x ) / ( static_cast<double>(x ) * log ( 1.0 - a ) );
  }
  return pdf;
}